

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

void __thiscall mprpc::MpRpcClient::MpRpcClient(MpRpcClient *this,shared_ptr<Connection> *conn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  rep rVar2;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (this->super_Connection_Callback)._vptr_Connection_Callback =
       (_func_int **)&PTR___cxa_pure_virtual_0015b5b8;
  loop::MsgLoopRun::MsgLoopRun(&this->super_MsgLoopRun);
  (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)&PTR_on_recv_0015b4b8;
  (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)&PTR__MpRpcClient_0015b4f0;
  (this->m_addr)._M_dataplus._M_p = (pointer)&(this->m_addr).field_2;
  (this->m_addr)._M_string_length = 0;
  (this->m_addr).field_2._M_local_buf[0] = '\0';
  (this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (conn->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (conn->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->m_callback = (MpRpcClient_Callback *)0x0;
  this->m_connected = false;
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_last_hb_rsp_time).__d.__r = rVar2;
  (this->m_last_hb_time).__d.__r = 0;
  (this->m_on_rsp_map)._M_h._M_buckets = &(this->m_on_rsp_map)._M_h._M_single_bucket;
  (this->m_on_rsp_map)._M_h._M_bucket_count = 1;
  (this->m_on_rsp_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_on_rsp_map)._M_h._M_element_count = 0;
  (this->m_on_rsp_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_on_rsp_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_on_rsp_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LOCK();
  (this->m_cur_callid).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x18);
  *(code **)local_40._M_unused._0_8_ = on_check_timer;
  *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
  *(MpRpcClient **)((long)local_40._M_unused._0_8_ + 0x10) = this;
  local_28 = std::
             _Function_handler<void_(),_std::_Bind<void_(mprpc::MpRpcClient::*(mprpc::MpRpcClient_*))()>_>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_std::_Bind<void_(mprpc::MpRpcClient::*(mprpc::MpRpcClient_*))()>_>
             ::_M_manager;
  loop::MessageLoop::post_delayed_task
            (&(this->super_MsgLoopRun).m_msg_loop,(Closure *)&local_40,100);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

MpRpcClient::MpRpcClient(shared_ptr<Connection> conn)
        : m_conn(conn)
        , m_callback(nullptr)
        , m_connected(false)
        , m_last_hb_rsp_time(system_clock::now())
        //, m_last_hb_time
    {
        m_cur_callid = 0;

        msg_loop().post_delayed_task(bind(&MpRpcClient::on_check_timer, this), 100);
    }